

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

bool __thiscall
CAPSFile::ReadRecordHeader(CAPSFile *this,uchar *buffer,RecordHeader *header_out,size_t size)

{
  uint uVar1;
  uint uVar2;
  uchar *buffer_00;
  ulong __n;
  bool bVar3;
  
  *(undefined4 *)header_out->type = *(undefined4 *)buffer;
  uVar1 = ExtractInt(buffer + 4);
  header_out->length = uVar1;
  uVar2 = ExtractInt(buffer + 8);
  header_out->crc = uVar2;
  __n = (ulong)uVar1;
  if (size < __n) {
    bVar3 = false;
  }
  else {
    buffer_00 = (uchar *)operator_new__(__n);
    memcpy(buffer_00,buffer,__n);
    buffer_00[8] = '\0';
    buffer_00[9] = '\0';
    buffer_00[10] = '\0';
    buffer_00[0xb] = '\0';
    uVar1 = CRC::ComputeCrc32(0xedb88320,buffer_00,uVar1);
    operator_delete__(buffer_00);
    bVar3 = uVar1 == header_out->crc;
  }
  return bVar3;
}

Assistant:

bool CAPSFile::ReadRecordHeader(const unsigned char* buffer, RecordHeader* header_out, size_t size)
{
   memcpy(header_out->type, &buffer[0], 4);
   header_out->length = ExtractInt(&buffer[4]);
   header_out->crc = ExtractInt(&buffer[8]);

   // Copy buffer to check
   if (header_out->length > size) return false;

   unsigned char* buffer_to_check = new unsigned char[header_out->length];
   memcpy(buffer_to_check, buffer, header_out->length);
   // Check the CRC
   memset(&buffer_to_check[8], 0, 4);

   unsigned int crc = CRC::ComputeCrc32(0xEDB88320, buffer_to_check, header_out->length);
   delete[] buffer_to_check;

   return (crc == header_out->crc);
}